

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_and_exp(SyntaxAnalyze *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SyntaxAnalyze *in_RSI;
  element_type *in_RDI;
  SharedExNdPtr SVar3;
  TyKind unaff_retaddr;
  SyntaxAnalyze *in_stack_00000008;
  string tmpName;
  Op op;
  SharedExNdPtr father;
  SharedExNdPtr second;
  SharedExNdPtr *first;
  element_type *in_stack_fffffffffffffe78;
  ExpressNode *in_stack_fffffffffffffe80;
  element_type *in_stack_fffffffffffffe88;
  SyntaxAnalyze *in_stack_fffffffffffffe90;
  ExpressNode *in_stack_fffffffffffffea0;
  bool local_139;
  undefined1 local_110 [32];
  undefined1 local_f0 [64];
  string local_b0 [32];
  string local_90 [4];
  Op in_stack_ffffffffffffff74;
  SharedExNdPtr *in_stack_ffffffffffffff78;
  SharedExNdPtr *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  SyntaxAnalyze *in_stack_ffffffffffffff90;
  uint3 in_stack_ffffffffffffffec;
  Token tk;
  
  tk = (Token)in_stack_ffffffffffffffec;
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2aed1e);
  gm_eq_exp(in_stack_00000008);
  std::shared_ptr<front::express::ExpressNode>::operator=
            ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe80,
             (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe78);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2aed51);
  while (bVar1 = try_word(in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                          (Token)in_stack_fffffffffffffe88), bVar1) {
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2aed85);
    operator_new(0x48);
    express::ExpressNode::ExpressNode(in_stack_fffffffffffffea0);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78);
    peVar2 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2aedc3);
    peVar2->_operation = OR;
    match_one_word(in_RSI,tk);
    gm_eq_exp(in_stack_00000008);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe80,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe78);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2aee1c);
    peVar2 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2aee26);
    if ((peVar2->_type == CNS) &&
       (peVar2 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2aee3c), peVar2->_type == CNS)) {
      peVar2 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aee52);
      peVar2->_type = CNS;
      peVar2 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aee62);
      local_139 = false;
      if (peVar2->_value != 0) {
        peVar2 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2aee7e);
        local_139 = peVar2->_value != 0;
      }
      peVar2 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aeea3);
      peVar2->_value = (uint)local_139;
    }
    else {
      std::__cxx11::string::string(local_90);
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                ((irGenerator *)in_stack_00000008,unaff_retaddr);
      std::__cxx11::string::operator=(local_90,local_b0);
      std::__cxx11::string::~string(local_b0);
      peVar2 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aef84);
      peVar2->_type = VAR;
      peVar2 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2aef94);
      std::__cxx11::string::operator=((string *)&peVar2->_name,local_90);
      std::__cxx11::string::string((string *)(local_f0 + 0x20),local_90);
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe80,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffea0 = (ExpressNode *)local_f0;
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe80,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe78);
      hp_gn_binary_mir(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
                       ,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2af022);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2af02f);
      std::__cxx11::string::~string((string *)(local_f0 + 0x20));
      std::__cxx11::string::~string(local_90);
    }
    in_stack_fffffffffffffe88 =
         std::
         __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2af0bb);
    in_stack_fffffffffffffe90 = (SyntaxAnalyze *)(local_110 + 0x10);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe80,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe78);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffe80,(SharedExNdPtr *)in_stack_fffffffffffffe78);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2af0f5);
    in_stack_fffffffffffffe78 =
         std::
         __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2af102);
    in_stack_fffffffffffffe80 = (ExpressNode *)local_110;
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe80,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe78);
    express::ExpressNode::addChild
              (in_stack_fffffffffffffe80,(SharedExNdPtr *)in_stack_fffffffffffffe78);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2af137);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe80,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffe78);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2af156);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2af163);
  }
  SVar3.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar3.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SharedExNdPtr)
         SVar3.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_and_exp() {
  SharedExNdPtr first;
  first = gm_eq_exp();

  while (try_word(1, Token::AND)) {
    SharedExNdPtr second;
    SharedExNdPtr father(new ExpressNode());
    Op op;

    father->_operation = OperationType::OR;

    match_one_word(Token::AND);
    op = Op::And;

    second = gm_eq_exp();

    if (first->_type == NodeType::CNS && second->_type == NodeType::CNS) {
      father->_type = NodeType::CNS;
      father->_value = first->_value && second->_value;
    } else {
      string tmpName;

      tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      father->_type = NodeType::VAR;
      father->_name = tmpName;

      hp_gn_binary_mir(tmpName, first, second, op);
    }
    father->addChild(first);
    father->addChild(second);
    first = father;
  }
  return first;
}